

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vector.cpp
# Opt level: O0

Reals __thiscall Omega_h::repeat_vector<1>(Omega_h *this,LO n,Vector<1> v)

{
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_90;
  undefined1 local_80 [8];
  type f;
  allocator local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  Write<double> vs;
  LO n_local;
  Vector<1> v_local;
  
  vs.shared_alloc_.direct_ptr._4_4_ = n;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"",&local_51);
  Write<double>::Write((Write<double> *)local_30,n,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  Write<double>::Write((Write<double> *)local_80,(Write<double> *)local_30);
  f.vs.shared_alloc_.direct_ptr = (void *)v.super_Few<double,_1>.array_[0];
  parallel_for<Omega_h::repeat_vector<1>(int,Omega_h::Vector<1>)::_lambda(int)_1_>
            (vs.shared_alloc_.direct_ptr._4_4_,(type *)local_80,"repeat_vector");
  Write<double>::Write(&local_90,(Write<signed_char> *)local_30);
  Read<double>::Read((Read<double> *)this,&local_90);
  Write<double>::~Write(&local_90);
  repeat_vector<1>(int,Omega_h::Vector<1>)::{lambda(int)#1}::~Vector((_lambda_int__1_ *)local_80);
  Write<double>::~Write((Write<double> *)local_30);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals repeat_vector(LO n, Vector<dim> v) {
  Write<Real> vs(n * dim);
  auto f = OMEGA_H_LAMBDA(LO i) { set_vector(vs, i, v); };
  parallel_for(n, f, "repeat_vector");
  return vs;
}